

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O1

string * MyCompiler::visitExpression
                   (string *__return_storage_ptr__,Expression *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  element_type *peVar1;
  pointer ppVar2;
  pointer pcVar3;
  int iVar4;
  string *psVar5;
  size_type *psVar6;
  long *plVar7;
  long lVar8;
  pointer ppVar9;
  bool bVar10;
  string aTerm;
  string secondTerm;
  string local_100;
  string local_e0;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  char local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  _Alloc_hider local_60 [2];
  long local_50 [2];
  size_type *local_40;
  pointer local_38;
  
  visitTerm(&local_100,
            (ast->pTerm).super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            result,usedIdents,tempIdentCounter);
  peVar1 = (ast->pAddSubOp).super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar10 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&(peVar1->super_AbstractAstNode).value);
    bVar10 = iVar4 == 0;
  }
  if (bVar10) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    nextTempIdent((string *)local_c0,usedIdents,tempIdentCounter);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"*","");
    local_a0._M_p = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"-1","");
    local_80._M_p = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    plVar7 = local_50;
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_60[0]._M_p = (pointer)plVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length);
    std::
    vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
    ::emplace_back<std::array<std::__cxx11::string,4ul>>
              ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                *)result,
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                *)local_c0);
    lVar8 = -0x80;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
  }
  else {
    ppVar9 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (ppVar9 == ppVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                      local_100.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_100.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_100._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                      local_100.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_100._M_string_length;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      goto LAB_0010a9f6;
    }
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  ppVar9 = (ast->vAddSubOpExpression).
           super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != local_38) {
    local_40 = &__return_storage_ptr__->_M_string_length;
    do {
      visitTerm(&local_e0,&ppVar9->second,result,usedIdents,tempIdentCounter);
      if (!bVar10) {
        nextTempIdent((string *)local_c0,usedIdents,tempIdentCounter);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c0);
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
      }
      local_c0._0_8_ = local_c0 + 0x10;
      pcVar3 = (ppVar9->first).super_AbstractAstNode.value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,pcVar3,
                 pcVar3 + (ppVar9->first).super_AbstractAstNode.value._M_string_length);
      local_a0._M_p = local_90;
      psVar5 = &local_100;
      if (bVar10) {
        psVar5 = __return_storage_ptr__;
      }
      pcVar3 = (psVar5->_M_dataplus)._M_p;
      psVar6 = &local_100._M_string_length;
      if (bVar10) {
        psVar6 = local_40;
      }
      std::__cxx11::string::_M_construct<char*>((string *)&local_a0,pcVar3,pcVar3 + *psVar6);
      local_80._M_p = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      local_60[0]._M_p = (pointer)local_50;
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length);
      std::
      vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
      ::emplace_back<std::array<std::__cxx11::string,4ul>>
                ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                  *)result,
                 (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)local_c0);
      lVar8 = -0x80;
      plVar7 = local_50;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      ppVar9 = ppVar9 + 1;
      bVar10 = true;
    } while (ppVar9 != local_38);
  }
LAB_0010a9f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::visitExpression(MyCompiler::Expression &ast,
                                        std::vector<std::array<std::string, 4>> &result,
                                        std::unordered_set<std::string> &usedIdents,
                                        int &tempIdentCounter)
{
    std::string aTerm = visitTerm(*ast.pTerm, result, usedIdents, tempIdentCounter);

    bool negative = ast.pAddSubOp != nullptr && ast.pAddSubOp->value == "-";
    if (!negative && ast.vAddSubOpExpression.empty())
        return aTerm;

    bool moreTerm = false;
    std::string temp;

    if (negative)
    {
        temp = nextTempIdent(usedIdents, tempIdentCounter);
        moreTerm = true;
        result.push_back({"*", "-1", aTerm, temp});
    }

    for (auto &item : ast.vAddSubOpExpression)
    {
        std::string secondTerm = visitTerm(item.second, result, usedIdents, tempIdentCounter);
        if (!moreTerm)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreTerm ? temp : aTerm,
                          secondTerm,
                          temp});
        moreTerm = true;
    }

    return temp;
}